

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

QRhiTexture * __thiscall
QRhi::newTexture(QRhi *this,Format format,int width,int height,int depth,int sampleCount,Flags flags
                )

{
  QFlagsStorage<QRhiTexture::Flag> QVar1;
  QFlagsStorage<QRhiTexture::Flag> QVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.i = (uint)flags.super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
                  super_QFlagsStorage<QRhiTexture::Flag>.i | 0x400;
  if (depth < 1) {
    QVar1.i = (Int)flags.super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
                   super_QFlagsStorage<QRhiTexture::Flag>.i;
  }
  QVar2.i = QVar1.i | 0x2000;
  if (depth != 0 || height != 0) {
    QVar2.i = QVar1.i;
  }
  local_10 = width;
  local_c = height;
  iVar3 = (*this->d->_vptr_QRhiImplementation[10])
                    (this->d,format,&local_10,(ulong)(uint)depth,0,sampleCount,QVar2.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRhiTexture *)CONCAT44(extraout_var,iVar3);
  }
  __stack_chk_fail();
}

Assistant:

QRhiTexture *QRhi::newTexture(QRhiTexture::Format format,
                              int width, int height, int depth,
                              int sampleCount,
                              QRhiTexture::Flags flags)
{
    if (depth > 0)
        flags |= QRhiTexture::ThreeDimensional;

    if (height == 0 && depth == 0)
        flags |= QRhiTexture::OneDimensional;

    return d->createTexture(format, QSize(width, height), depth, 0, sampleCount, flags);
}